

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

void read_cdef(AV1_COMMON *cm,aom_reader *r,MACROBLOCKD *xd)

{
  uint8_t uVar1;
  uint uVar2;
  SequenceHeader *pSVar3;
  MB_MODE_INFO *pMVar4;
  uint uVar5;
  ulong uVar6;
  
  if (((cm->features).coded_lossless == false) && ((cm->features).allow_intrabc == false)) {
    uVar1 = (*xd->mi)->skip_txfm;
    pSVar3 = cm->seq_params;
    uVar5 = xd->mi_row;
    uVar2 = xd->mi_col;
    if ((pSVar3->mib_size - 1U & (uVar2 | uVar5)) == 0) {
      xd->cdef_transmitted[0] = false;
      xd->cdef_transmitted[1] = false;
      xd->cdef_transmitted[2] = false;
      xd->cdef_transmitted[3] = false;
    }
    uVar6 = 0;
    if (pSVar3->sb_size == BLOCK_128X128) {
      uVar6 = (ulong)(uVar5 >> 3 & 2 | uVar2 >> 4 & 1);
    }
    if ((xd->cdef_transmitted[uVar6] == false) && (uVar1 == '\0')) {
      pMVar4 = (cm->mi_params).mi_grid_base
               [(int)((uVar5 & 0xfffffff0) * (cm->mi_params).mi_stride + (uVar2 & 0xfffffff0))];
      uVar5 = aom_read_literal_(r,(cm->cdef_info).cdef_bits);
      *(ushort *)&pMVar4->field_0xa7 =
           *(ushort *)&pMVar4->field_0xa7 & 0x87ff | (ushort)((uVar5 & 0xf) << 0xb);
      xd->cdef_transmitted[uVar6] = true;
    }
  }
  return;
}

Assistant:

static void read_cdef(AV1_COMMON *cm, aom_reader *r, MACROBLOCKD *const xd) {
  const int skip_txfm = xd->mi[0]->skip_txfm;
  if (cm->features.coded_lossless) return;
  if (cm->features.allow_intrabc) {
    assert(cm->cdef_info.cdef_bits == 0);
    return;
  }

  // At the start of a superblock, mark that we haven't yet read CDEF strengths
  // for any of the CDEF units contained in this superblock.
  const int sb_mask = (cm->seq_params->mib_size - 1);
  const int mi_row_in_sb = (xd->mi_row & sb_mask);
  const int mi_col_in_sb = (xd->mi_col & sb_mask);
  if (mi_row_in_sb == 0 && mi_col_in_sb == 0) {
    xd->cdef_transmitted[0] = xd->cdef_transmitted[1] =
        xd->cdef_transmitted[2] = xd->cdef_transmitted[3] = false;
  }

  // CDEF unit size is 64x64 irrespective of the superblock size.
  const int cdef_size = 1 << (6 - MI_SIZE_LOG2);

  // Find index of this CDEF unit in this superblock.
  const int index_mask = cdef_size;
  const int cdef_unit_row_in_sb = ((xd->mi_row & index_mask) != 0);
  const int cdef_unit_col_in_sb = ((xd->mi_col & index_mask) != 0);
  const int index = (cm->seq_params->sb_size == BLOCK_128X128)
                        ? cdef_unit_col_in_sb + 2 * cdef_unit_row_in_sb
                        : 0;

  // Read CDEF strength from the first non-skip coding block in this CDEF unit.
  if (!xd->cdef_transmitted[index] && !skip_txfm) {
    // CDEF strength for this CDEF unit needs to be read into the MB_MODE_INFO
    // of the 1st block in this CDEF unit.
    const int first_block_mask = ~(cdef_size - 1);
    CommonModeInfoParams *const mi_params = &cm->mi_params;
    const int grid_idx =
        get_mi_grid_idx(mi_params, xd->mi_row & first_block_mask,
                        xd->mi_col & first_block_mask);
    MB_MODE_INFO *const mbmi = mi_params->mi_grid_base[grid_idx];
    mbmi->cdef_strength =
        aom_read_literal(r, cm->cdef_info.cdef_bits, ACCT_STR);
    xd->cdef_transmitted[index] = true;
  }
}